

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_copy(void **param_1)

{
  roaring64_bitmap_t *b;
  roaring64_bitmap_t *prVar1;
  char *in_RDI;
  roaring64_bitmap_t *r2;
  roaring64_bitmap_t *r1;
  roaring64_bitmap_t *in_stack_00000080;
  roaring64_bitmap_t *in_stack_000000a0;
  int line;
  
  b = roaring64_bitmap_create();
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  prVar1 = roaring64_bitmap_copy(in_stack_000000a0);
  line = (int)((ulong)prVar1 >> 0x20);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_remove((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  roaring64_bitmap_add((roaring64_bitmap_t *)r2,(uint64_t)in_RDI);
  assert_r64_valid((roaring64_bitmap_t *)b);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_contains((roaring64_bitmap_t *)r1,(uint64_t)r2);
  _assert_true((unsigned_long)r2,in_RDI,(char *)b,line);
  roaring64_bitmap_free(in_stack_00000080);
  roaring64_bitmap_free(in_stack_00000080);
  return;
}

Assistant:

DEFINE_TEST(test_copy) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    assert_r64_valid(r1);

    roaring64_bitmap_add(r1, 0);
    roaring64_bitmap_add(r1, 10000);
    roaring64_bitmap_add(r1, 200000);

    roaring64_bitmap_t* r2 = roaring64_bitmap_copy(r1);
    assert_r64_valid(r1);
    assert_true(roaring64_bitmap_contains(r2, 0));
    assert_true(roaring64_bitmap_contains(r2, 10000));
    assert_true(roaring64_bitmap_contains(r2, 200000));

    roaring64_bitmap_remove(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    assert_r64_valid(r1);
    assert_true(roaring64_bitmap_contains(r2, 200000));
    assert_false(roaring64_bitmap_contains(r2, 300000));

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
}